

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void __thiscall
xmrig::JobBaton::JobBaton
          (JobBaton *this,list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *bundles,
          IJobResultListener *listener,bool hwAES)

{
  byte bVar1;
  byte in_CL;
  undefined8 in_RDX;
  Baton<uv_work_s> *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  Baton<uv_work_s>::Baton(in_RDI);
  *(byte *)&in_RDI[1].req.data = bVar1 & 1;
  *(undefined8 *)&in_RDI[1].req.type = in_RDX;
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::list
            ((list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffffe0),
             (list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)in_RDI);
  std::vector<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::vector
            ((vector<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)0x233706);
  *(undefined4 *)&in_RDI[1].req.loop = 0;
  return;
}

Assistant:

inline JobBaton(std::list<JobBundle> &&bundles, IJobResultListener *listener, bool hwAES) :
        hwAES(hwAES),
        listener(listener),
        bundles(std::move(bundles))
    {}